

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_fuzzer.cc
# Opt level: O2

void __thiscall FuzzHelper::doChecks(FuzzHelper *this)

{
  size_t in_RCX;
  Pl_ASCIIHexDecoder p;
  Pl_Discard discard;
  Pl_ASCIIHexDecoder PStack_88;
  Pipeline local_40;
  
  Pl_Discard::Pl_Discard((Pl_Discard *)&local_40);
  Pl_ASCIIHexDecoder::Pl_ASCIIHexDecoder(&PStack_88,"decode",&local_40);
  Pl_ASCIIHexDecoder::write(&PStack_88,(int)this->data,(void *)this->size,in_RCX);
  Pl_ASCIIHexDecoder::finish(&PStack_88);
  Pipeline::~Pipeline(&PStack_88.super_Pipeline);
  Pl_Discard::~Pl_Discard((Pl_Discard *)&local_40);
  return;
}

Assistant:

void
FuzzHelper::doChecks()
{
    Pl_Discard discard;
    Pl_ASCIIHexDecoder p("decode", &discard);
    p.write(const_cast<unsigned char*>(data), size);
    p.finish();
}